

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2::normalizeUTF8
          (Normalizer2 *this,uint32_t param_1,StringPiece src,ByteSink *sink,Edits *edits,
          UErrorCode *errorCode)

{
  StringPiece utf8;
  UnicodeString src16;
  UnicodeString local_a0;
  UnicodeString local_60;
  
  utf8._8_8_ = src._8_8_;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (edits == (Edits *)0x0) {
      utf8.ptr_ = (char *)(ulong)(uint)src.length_;
      UnicodeString::fromUTF8(&local_60,(UnicodeString *)src.ptr_,utf8);
      local_a0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f7be0
      ;
      local_a0.fUnion.fStackFields.fLengthAndFlags = 2;
      (*(this->super_UObject)._vptr_UObject[3])(this,&local_60,&local_a0,errorCode);
      UnicodeString::toUTF8(&local_a0,sink);
      UnicodeString::~UnicodeString(&local_a0);
      UnicodeString::~UnicodeString(&local_60);
    }
    else {
      *errorCode = U_UNSUPPORTED_ERROR;
    }
  }
  return;
}

Assistant:

void
Normalizer2::normalizeUTF8(uint32_t /*options*/, StringPiece src, ByteSink &sink,
                           Edits *edits, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return;
    }
    if (edits != nullptr) {
        errorCode = U_UNSUPPORTED_ERROR;
        return;
    }
    UnicodeString src16 = UnicodeString::fromUTF8(src);
    normalize(src16, errorCode).toUTF8(sink);
}